

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

void __thiscall
vkt::BindingModel::anon_unknown_1::QuadrantRendederCase::initPrograms
          (QuadrantRendederCase *this,SourceCollections *programCollection)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ProgramSources *pPVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  long *plVar8;
  undefined8 *puVar9;
  GLSLVersion in_ECX;
  GLSLVersion GVar10;
  ulong *puVar11;
  long *plVar12;
  char **value;
  char **value_00;
  long lVar13;
  char *pcVar14;
  char *nextStageName;
  ostringstream buf;
  undefined1 auStack_378 [8];
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  uint local_2d0;
  value_type local_2c8;
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  string local_288;
  string local_268;
  long *local_248;
  long local_240;
  long local_238 [2];
  long local_228 [14];
  ios_base local_1b8 [264];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  uVar3 = this->m_exitingStages;
  if ((uVar3 & 1) != 0) {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"vertex","");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_268);
    in_ECX = this->m_exitingStages;
    if ((in_ECX & GLSL_VERSION_310_ES) == GLSL_VERSION_100_ES) {
      pcVar14 = "mediump";
      if ((in_ECX & GLSL_VERSION_400) == GLSL_VERSION_100_ES) {
        local_248 = (long *)0x0;
        GVar10 = in_ECX & 0x10;
        in_ECX = 0xb0e733;
        if (GVar10 != GLSL_VERSION_100_ES) {
          local_248 = (long *)0xb0e733;
        }
      }
      else {
        local_248 = (long *)0xaae4ce;
      }
    }
    else {
      local_248 = (long *)0xabe538;
      pcVar14 = "highp";
    }
    pcVar5 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    uVar3 = this->m_activeStages;
    if ((uVar3 & 1) == 0) {
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_228,local_370._M_dataplus._M_p,local_370._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"layout(location = 1) flat out highp int ",0x28);
      plVar8 = local_248;
      if (local_248 == (long *)0x0) {
        std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
      }
      else {
        sVar6 = strlen((char *)local_248);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)plVar8,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_quadrant_id;\n",0xe);
      BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                (&local_350,(_anonymous_namespace_ *)&DAT_00000001,this->m_glslVersion,in_ECX);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_350._M_dataplus._M_p,local_350._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\thighp vec4 result_position;\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp int quadrant_id;\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "\thighp int quadPhase = gl_VertexIndex % 6;\n\thighp int quadXcoord = int(quadPhase == 1 || quadPhase == 4 || quadPhase == 5);\n\thighp int quadYcoord = int(quadPhase == 2 || quadPhase == 3 || quadPhase == 5);\n\thighp int quadOriginX = (gl_VertexIndex / 6) % 2;\n\thighp int quadOriginY = (gl_VertexIndex / 6) / 2;\n\tquadrant_id = gl_VertexIndex / 6;\n\tresult_position = vec4(float(quadOriginX + quadXcoord - 1), float(quadOriginY + quadYcoord - 1), 0.0, 1.0);\n"
                 ,0x1c3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_Position = result_position;\n",0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
      plVar8 = local_248;
      if (local_248 == (long *)0x0) {
        std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
      }
      else {
        sVar6 = strlen((char *)local_248);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)plVar8,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"_quadrant_id = quadrant_id;\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
    }
    else {
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_228,local_370._M_dataplus._M_p,local_370._M_string_length
                         );
      puVar11 = (ulong *)0x0;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_350,this,1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_350._M_dataplus._M_p,local_350._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"layout(location = 0) out ",0x19);
      sVar6 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar14,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," vec4 ",6);
      plVar8 = local_248;
      if (local_248 == (long *)0x0) {
        std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
      }
      else {
        sVar6 = strlen((char *)local_248);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)plVar8,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_color;\n",8);
      if (uVar3 == 1) {
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        local_330._M_string_length = 0;
        local_330.field_2._M_allocated_capacity =
             local_330.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        de::toString<char_const*>(&local_50,(de *)&local_248,value);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0xabe53c);
        local_90 = &local_80;
        plVar12 = plVar8 + 2;
        if ((long *)*plVar8 == plVar12) {
          local_80 = *plVar12;
          lStack_78 = plVar8[3];
        }
        else {
          local_80 = *plVar12;
          local_90 = (long *)*plVar8;
        }
        local_88 = plVar8[1];
        *plVar8 = (long)plVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        puVar11 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_330.field_2._M_allocated_capacity = *puVar11;
          local_330.field_2._8_8_ = plVar8[3];
        }
        else {
          local_330.field_2._M_allocated_capacity = *puVar11;
          local_330._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_330._M_string_length = plVar8[1];
        *plVar8 = (long)puVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_330._M_dataplus._M_p,local_330._M_string_length);
      BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                (&local_310,(_anonymous_namespace_ *)&DAT_00000001,this->m_glslVersion,
                 (GLSLVersion)puVar11);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_310._M_dataplus._M_p,local_310._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\thighp vec4 result_position;\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp int quadrant_id;\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "\thighp int quadPhase = gl_VertexIndex % 6;\n\thighp int quadXcoord = int(quadPhase == 1 || quadPhase == 4 || quadPhase == 5);\n\thighp int quadYcoord = int(quadPhase == 2 || quadPhase == 3 || quadPhase == 5);\n\thighp int quadOriginX = (gl_VertexIndex / 6) % 2;\n\thighp int quadOriginY = (gl_VertexIndex / 6) / 2;\n\tquadrant_id = gl_VertexIndex / 6;\n\tresult_position = vec4(float(quadOriginX + quadXcoord - 1), float(quadOriginY + quadYcoord - 1), 0.0, 1.0);\n"
                 ,0x1c3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_Position = result_position;\n",0x20);
      if (uVar3 == 1) {
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        local_2f0._M_string_length = 0;
        local_2f0.field_2._M_allocated_capacity =
             local_2f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        de::toString<char_const*>(&local_70,(de *)&local_248,value_00);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0xa99b86);
        local_b0 = &local_a0;
        plVar12 = plVar8 + 2;
        if ((long *)*plVar8 == plVar12) {
          local_a0 = *plVar12;
          lStack_98 = plVar8[3];
        }
        else {
          local_a0 = *plVar12;
          local_b0 = (long *)*plVar8;
        }
        local_a8 = plVar8[1];
        *plVar8 = (long)plVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        puVar11 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_2f0.field_2._M_allocated_capacity = *puVar11;
          local_2f0.field_2._8_8_ = puVar9[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *puVar11;
          local_2f0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_2f0._M_string_length = puVar9[1];
        *puVar9 = puVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
      }
      in_ECX = (GLSLVersion)puVar11;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp vec4 result_color;\n",0x1a)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_2a8,this,1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_2a8,local_2a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
      plVar8 = local_248;
      if (local_248 == (long *)0x0) {
        std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
      }
      else {
        sVar6 = strlen((char *)local_248);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)plVar8,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_color = result_color;\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
      if (local_2a8 != local_298) {
        operator_delete(local_2a8,local_298[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if (uVar3 == 1) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        local_50.field_2._M_allocated_capacity = local_330.field_2._M_allocated_capacity;
        local_50._M_dataplus._M_p = local_330._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
LAB_00505777:
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00505777;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    std::ios_base::~ios_base(local_1b8);
    local_2d0 = 0;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,local_288._M_dataplus._M_p,
               local_288._M_dataplus._M_p + local_288._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar4->sources + local_2d0,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    uVar3 = this->m_exitingStages;
  }
  if ((uVar3 & 2) != 0) {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"tess_ctrl","");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_2f0);
    pcVar14 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    bVar2 = glu::glslVersionIsES(this->m_glslVersion);
    bVar1 = 2 < (int)this->m_glslVersion;
    pcVar5 = "";
    if (bVar2 && !bVar1) {
      pcVar5 = "#extension GL_EXT_tessellation_shader : require\n";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    if ((this->m_activeStages & 2) == 0) {
      if ((this->m_activeStages & 4) != 0) {
        if (pcVar14 == (char *)0x0) {
          std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
        }
        else {
          sVar6 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
        lVar13 = 0x30;
        if (!bVar2 || bVar1) {
          lVar13 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar5,lVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"layout(vertices=3) out;\n",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,
                   "layout(location = 1) flat in highp int tsc_quadrant_id[];\n",0x3a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,
                   "layout(location = 1) flat out highp int tes_quadrant_id[];\n",0x3b);
        BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                  (&local_370,(_anonymous_namespace_ *)0x2,this->m_glslVersion,in_ECX);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_228,local_370._M_dataplus._M_p,
                            local_370._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\ttes_quadrant_id[gl_InvocationID] = tsc_quadrant_id[0];\n",0x38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\t// no dynamic input block indexing\n",0x24);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp vec4 position;\n",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\tif (gl_InvocationID == 0)\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\t\tposition = gl_in[0].gl_Position;\n",0x23);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\telse if (gl_InvocationID == 1)\n",0x20);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\t\tposition = gl_in[1].gl_Position;\n",0x23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\telse\n",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\t\tposition = gl_in[2].gl_Position;\n",0x23);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\tgl_out[gl_InvocationID].gl_Position = position;\n",0x31);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\tgl_TessLevelInner[0] = 2.8;\n",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\tgl_TessLevelInner[1] = 2.8;\n",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\tgl_TessLevelOuter[0] = 2.8;\n",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\tgl_TessLevelOuter[1] = 2.8;\n",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\tgl_TessLevelOuter[2] = 2.8;\n",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\tgl_TessLevelOuter[3] = 2.8;\n",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
        goto LAB_00505f3b;
      }
    }
    else {
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
      }
      else {
        sVar6 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
      lVar13 = 0x30;
      if (!bVar2 || bVar1) {
        lVar13 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar5,lVar13);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_228,local_370._M_dataplus._M_p,local_370._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"layout(vertices=3) out;\n",0x18);
      in_ECX = GLSL_VERSION_100_ES;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_350,this,2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_350._M_dataplus._M_p,local_350._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"layout(location = 1) flat in highp int tsc_quadrant_id[];\n",0x3a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"layout(location = 0) out highp vec4 tes_color[];\n",0x31);
      BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                (&local_330,(_anonymous_namespace_ *)0x2,this->m_glslVersion,in_ECX);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_330._M_dataplus._M_p,local_330._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp vec4 result_color;\n",0x1a)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\thighp int quadrant_id = tsc_quadrant_id[gl_InvocationID];\n",0x3b);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_310,this,2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_310._M_dataplus._M_p,local_310._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\ttes_color[gl_InvocationID] = result_color;\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\t// no dynamic input block indexing\n",0x24);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp vec4 position;\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tif (gl_InvocationID == 0)\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\t\tposition = gl_in[0].gl_Position;\n",0x23);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\telse if (gl_InvocationID == 1)\n",0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\t\tposition = gl_in[1].gl_Position;\n",0x23);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\telse\n",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\t\tposition = gl_in[2].gl_Position;\n",0x23);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_out[gl_InvocationID].gl_Position = position;\n",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_TessLevelInner[0] = 2.8;\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_TessLevelInner[1] = 2.8;\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_TessLevelOuter[0] = 2.8;\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_TessLevelOuter[1] = 2.8;\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_TessLevelOuter[2] = 2.8;\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_TessLevelOuter[3] = 2.8;\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
LAB_00505f3b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    std::ios_base::~ios_base(local_1b8);
    local_2d0 = 3;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,local_2a8,(long)local_2a8 + local_2a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar4->sources + local_2d0,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    uVar3 = this->m_exitingStages;
  }
  if ((uVar3 & 4) != 0) {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"tess_eval","");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_2f0);
    pcVar14 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    bVar2 = glu::glslVersionIsES(this->m_glslVersion);
    bVar1 = 2 < (int)this->m_glslVersion;
    pcVar5 = "";
    if (bVar2 && !bVar1) {
      pcVar5 = "#extension GL_EXT_tessellation_shader : require\n";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    if ((this->m_activeStages & 4) == 0) {
      if ((this->m_activeStages & 2) != 0) {
        if (pcVar14 == (char *)0x0) {
          std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
        }
        else {
          sVar6 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
        lVar13 = 0x30;
        if (!bVar2 || bVar1) {
          lVar13 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar5,lVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"layout(triangles) in;\n",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"layout(location = 0) in highp vec4 tes_color[];\n",0x30);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"layout(location = 0) out mediump vec4 frag_color;\n",0x32);
        BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                  (&local_370,(_anonymous_namespace_ *)0x4,this->m_glslVersion,in_ECX);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_228,local_370._M_dataplus._M_p,
                            local_370._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\tfrag_color = tes_color[0];\n",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
                   ,0x86);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
        goto LAB_00506484;
      }
    }
    else {
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
      }
      else {
        sVar6 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
      lVar13 = 0x30;
      if (!bVar2 || bVar1) {
        lVar13 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar5,lVar13);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,4);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_228,local_370._M_dataplus._M_p,local_370._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"layout(triangles) in;\n",0x16);
      GVar10 = GLSL_VERSION_100_ES;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_350,this,4);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_350._M_dataplus._M_p,local_350._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"layout(location = 1) flat in highp int tes_quadrant_id[];\n",0x3a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"layout(location = 0) out mediump vec4 frag_color;\n",0x32);
      BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                (&local_330,(_anonymous_namespace_ *)0x4,this->m_glslVersion,GVar10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_330._M_dataplus._M_p,local_330._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp vec4 result_color;\n",0x1a)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\thighp int quadrant_id = tes_quadrant_id[0];\n",0x2d);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_310,this,4);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_310._M_dataplus._M_p,local_310._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tfrag_color = result_color;\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
                 ,0x86);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
LAB_00506484:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    std::ios_base::~ios_base(local_1b8);
    local_2d0 = 4;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,local_2a8,(long)local_2a8 + local_2a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar4->sources + local_2d0,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    uVar3 = this->m_exitingStages;
  }
  if ((uVar3 & 8) != 0) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"geometry","");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_288);
    pcVar14 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    bVar2 = glu::glslVersionIsES(this->m_glslVersion);
    bVar1 = 2 < (int)this->m_glslVersion;
    pcVar5 = "";
    if (bVar2 && !bVar1) {
      pcVar5 = "#extension GL_EXT_geometry_shader : require\n";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    if ((this->m_activeStages & 8) != 0) {
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
      }
      else {
        sVar6 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
      lVar13 = 0x2c;
      if (!bVar2 || bVar1) {
        lVar13 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar5,lVar13);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_228,local_370._M_dataplus._M_p,local_370._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"layout(triangles) in;\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"layout(triangle_strip, max_vertices=4) out;\n",0x2c);
      GVar10 = GLSL_VERSION_100_ES;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_350,this,8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_350._M_dataplus._M_p,local_350._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"layout(location = 1) flat in highp int geo_quadrant_id[];\n",0x3a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"layout(location = 0) out mediump vec4 frag_color;\n",0x32);
      BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                (&local_330,(_anonymous_namespace_ *)0x8,this->m_glslVersion,GVar10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_330._M_dataplus._M_p,local_330._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp int quadrant_id;\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp vec4 result_color;\n",0x1a)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tquadrant_id = geo_quadrant_id[0];\n",0x23);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_310,this,8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_310._M_dataplus._M_p,local_310._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tfrag_color = result_color;\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_Position = gl_in[0].gl_Position;\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tEmitVertex();\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tquadrant_id = geo_quadrant_id[1];\n",0x23);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_2f0,this,8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tfrag_color = result_color;\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_Position = gl_in[1].gl_Position;\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tEmitVertex();\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tquadrant_id = geo_quadrant_id[2];\n",0x23);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_2a8,this,8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_2a8,local_2a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tfrag_color = result_color;\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_Position = gl_in[0].gl_Position * 0.5 + gl_in[2].gl_Position * 0.5;\n"
                 ,0x48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tEmitVertex();\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tquadrant_id = geo_quadrant_id[0];\n",0x23);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_268,this,8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tfrag_color = result_color;\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\tgl_Position = gl_in[2].gl_Position;\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tEmitVertex();\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if (local_2a8 != local_298) {
        operator_delete(local_2a8,local_298[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    std::ios_base::~ios_base(local_1b8);
    local_2d0 = 2;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,local_248,(long)local_248 + local_240);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar4->sources + local_2d0,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    uVar3 = this->m_exitingStages;
  }
  if ((uVar3 & 0x10) == 0) goto LAB_00506ffa;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"fragment","");
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_330);
  pcVar14 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  if ((this->m_activeStages & 0x10) == 0) {
    if (this->m_activeStages != 0) {
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
      }
      else {
        sVar6 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
      lVar13 = 0x8c;
      pcVar14 = 
      "layout(location = 0) in mediump vec4 frag_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = frag_color;\n}\n"
      ;
      goto LAB_00506f1f;
    }
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
    }
    else {
      sVar6 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"layout(location = 1) flat in highp int frag_quadrant_id;\n",
               0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"\thighp int quadrant_id = frag_quadrant_id;\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"\thighp vec4 result_color;\n",0x1a);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])(&local_370,this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_228,local_370._M_dataplus._M_p,local_370._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\to_color = result_color;\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
    }
    else {
      sVar6 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_228,local_370._M_dataplus._M_p,local_370._M_string_length);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
              (&local_350,this,0x10,0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,local_350._M_dataplus._M_p,local_350._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (this->m_activeStages != 0x10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"layout(location = 0) in mediump vec4 frag_color;\n",0x31);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"layout(location = 1) flat in highp int frag_quadrant_id;\n",
               0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"\thighp int quadrant_id = frag_quadrant_id;\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"\thighp vec4 result_color;\n",0x1a);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_370,this,0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,local_370._M_dataplus._M_p,local_370._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (this->m_activeStages == 0x10) {
      lVar13 = 0x19;
      pcVar14 = "\to_color = result_color;\n";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"\tif (frag_quadrant_id < 2)\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"\t\to_color = result_color;\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\telse\n",6);
      lVar13 = 0x18;
      pcVar14 = "\t\to_color = frag_color;\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,lVar13);
    lVar13 = 2;
    pcVar14 = "}\n";
LAB_00506f1f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,lVar13);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  local_2d0 = 1;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_310._M_dataplus._M_p,
             local_310._M_dataplus._M_p + local_310._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + local_2d0,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  uVar3 = this->m_exitingStages;
LAB_00506ffa:
  if ((uVar3 & 0x20) != 0) {
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"compute","");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_310);
    pcVar14 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_228[0] + -0x18) + 0x150);
    }
    else {
      sVar6 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,0x20);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_228,local_370._M_dataplus._M_p,local_370._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x41);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
              (&local_350,this,0x20,1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_350._M_dataplus._M_p,local_350._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp vec4 read_colors[4];\n",0x1c)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"} b_out;\n",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\thighp int quadrant_id = int(gl_WorkGroupID.x);\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\thighp vec4 result_color;\n",0x1a);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_330,this,0x20);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_330._M_dataplus._M_p,local_330._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\tb_out.read_colors[gl_WorkGroupID.x] = result_color;\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    std::ios_base::~ios_base(local_1b8);
    local_2d0 = 5;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,local_2f0._M_dataplus._M_p,
               local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar4->sources + local_2d0,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void QuadrantRendederCase::initPrograms (vk::SourceCollections& programCollection) const
{
	if ((m_exitingStages & vk::VK_SHADER_STAGE_VERTEX_BIT) != 0u)
		programCollection.glslSources.add("vertex") << glu::VertexSource(genVertexSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0u)
		programCollection.glslSources.add("tess_ctrl") << glu::TessellationControlSource(genTessCtrlSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0u)
		programCollection.glslSources.add("tess_eval") << glu::TessellationEvaluationSource(genTessEvalSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_GEOMETRY_BIT) != 0u)
		programCollection.glslSources.add("geometry") << glu::GeometrySource(genGeometrySource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_FRAGMENT_BIT) != 0u)
		programCollection.glslSources.add("fragment") << glu::FragmentSource(genFragmentSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_COMPUTE_BIT) != 0u)
		programCollection.glslSources.add("compute") << glu::ComputeSource(genComputeSource());
}